

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O2

void __thiscall
CheckedSharedMutexTest_AbandonMutexSide_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_AbandonMutexSide_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  DeathTest *pDVar1;
  DeathTest *pDVar2;
  bool bVar3;
  int iVar4;
  char *message;
  DeathTest DVar5;
  DeathTest *gtest_dt;
  anon_class_1_0_00000001 test_body;
  ReturnSentinel gtest_sentinel;
  Message local_68 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)gtest_sentinel.test_);
    bVar3 = testing::internal::DeathTest::Create
                      ("test_body()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0x11d,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    pDVar1 = gtest_dt;
    if (bVar3) {
      if (gtest_dt == (DeathTest *)0x0) {
        return;
      }
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar2 = gtest_dt;
      if (iVar4 == 0) {
        testing::KilledBySignal::KilledBySignal((KilledBySignal *)local_68,6);
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])();
        bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)local_68,iVar4);
        iVar4 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*pDVar1->_vptr_DeathTest[1])(pDVar1);
          goto LAB_001869bc;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          TestBody::anon_class_1_0_00000001::operator()(&test_body);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)pDVar1->_vptr_DeathTest;
      local_68[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )pDVar1;
      goto LAB_00186a0d;
    }
  }
LAB_001869bc:
  testing::Message::Message(local_68);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_dt,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,0x11d,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,local_68);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
  if (local_68[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl ==
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    return;
  }
  DVar5._vptr_DeathTest =
       *(_func_int ***)
        local_68[0].ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
LAB_00186a0d:
  (*DVar5._vptr_DeathTest[1])
            (local_68[0].ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, AbandonMutexSide) {
  auto test_body = []{
    yamc::test::barrier step(2);
    auto pmtx = yamc::cxx::make_unique<TypeParam>();
    // owner-thread
    yamc::test::join_thread thd([&]{
      ASSERT_NO_THROW(pmtx->lock_shared());
      step.await();  // b1
      step.await();  // b2
    });
    // other-thread
    {
      step.await();  // b1
      EXPECT_CHECK_FAILURE_INNER({
        delete pmtx.release();
      });
      step.await();  // b2
    }
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}